

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

Expression cnn::expr::contract3d_1d_1d(Expression *x,Expression *y,Expression *z,Expression *b)

{
  long in_RCX;
  long in_RDX;
  undefined8 extraout_RDX;
  undefined8 *in_RSI;
  ComputationGraph *in_RDI;
  ComputationGraph *in_R8;
  Expression EVar1;
  VariableIndex *i;
  ComputationGraph *pg;
  Expression *this;
  VariableIndex local_50;
  VariableIndex VStack_4c;
  VariableIndex VStack_48;
  VariableIndex VStack_44;
  VariableIndex *local_40;
  undefined8 local_38;
  initializer_list<cnn::VariableIndex> *in_stack_ffffffffffffffd0;
  
  this = (Expression *)*in_RSI;
  i = (VariableIndex *)*in_RSI;
  pg = in_RDI;
  VariableIndex::VariableIndex(&local_50,(VariableIndex *)(in_RSI + 1));
  VariableIndex::VariableIndex(&VStack_4c,(VariableIndex *)(in_RDX + 8));
  VariableIndex::VariableIndex(&VStack_48,(VariableIndex *)(in_RCX + 8));
  VariableIndex::VariableIndex
            (&VStack_44,
             (VariableIndex *)
             &(in_R8->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish);
  local_40 = &local_50;
  local_38 = 4;
  ComputationGraph::add_function<cnn::InnerProduct3D_1D_1D>(in_R8,in_stack_ffffffffffffffd0);
  Expression::Expression(this,pg,i);
  EVar1._8_8_ = extraout_RDX;
  EVar1.pg = in_RDI;
  return EVar1;
}

Assistant:

Expression contract3d_1d_1d(const Expression& x, const Expression& y, const Expression& z, const Expression& b) { return Expression(x.pg, x.pg->add_function<InnerProduct3D_1D_1D>({x.i, y.i, z.i, b.i})); }